

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5yyStackOverflow(fts5yyParser *fts5yypParser)

{
  Fts5Parse *pParse_00;
  Fts5Parse *pParse;
  fts5yyParser *fts5yypParser_local;
  
  pParse_00 = fts5yypParser->pParse;
  while (fts5yypParser->fts5yystack < fts5yypParser->fts5yytos) {
    fts5yy_pop_parser_stack(fts5yypParser);
  }
  sqlite3Fts5ParseError(pParse_00,"fts5: parser stack overflow");
  fts5yypParser->pParse = pParse_00;
  return;
}

Assistant:

static void fts5yyStackOverflow(fts5yyParser *fts5yypParser){
   sqlite3Fts5ParserARG_FETCH
   sqlite3Fts5ParserCTX_FETCH
#ifndef NDEBUG
   if( fts5yyTraceFILE ){
     fprintf(fts5yyTraceFILE,"%sStack Overflow!\n",fts5yyTracePrompt);
   }
#endif
   while( fts5yypParser->fts5yytos>fts5yypParser->fts5yystack ) fts5yy_pop_parser_stack(fts5yypParser);
   /* Here code is inserted which will execute if the parser
   ** stack every overflows */
/******** Begin %stack_overflow code ******************************************/

  sqlite3Fts5ParseError(pParse, "fts5: parser stack overflow");
/******** End %stack_overflow code ********************************************/
   sqlite3Fts5ParserARG_STORE /* Suppress warning about unused %extra_argument var */
   sqlite3Fts5ParserCTX_STORE
}